

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<unsigned_long,_8UL>::SmallVector(SmallVector<unsigned_long,_8UL> *this)

{
  unsigned_long *puVar1;
  SmallVector<unsigned_long,_8UL> *this_local;
  
  VectorView<unsigned_long>::VectorView(&this->super_VectorView<unsigned_long>);
  this->buffer_capacity = 0;
  puVar1 = AlignedBuffer<unsigned_long,_8UL>::data(&this->stack_storage);
  (this->super_VectorView<unsigned_long>).ptr = puVar1;
  this->buffer_capacity = 8;
  return;
}

Assistant:

SmallVector() SPIRV_CROSS_NOEXCEPT
	{
		this->ptr = stack_storage.data();
		buffer_capacity = N;
	}